

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

void __thiscall
wasm::WATParser::ParseImplicitTypeDefsCtx::ParseImplicitTypeDefsCtx
          (ParseImplicitTypeDefsCtx *this,Lexer *in,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
          *implicitTypes,IndexMap *typeIndices)

{
  bool bVar1;
  reference pHVar2;
  size_t sVar3;
  optional<wasm::HeapType> oVar4;
  Signature SVar5;
  byte local_ca;
  Signature local_a0;
  pair<const_wasm::Signature,_wasm::HeapType> local_90;
  _Storage<wasm::HeapType,_true> local_78;
  undefined1 local_70;
  RecGroup local_68 [3];
  HeapType local_50;
  HeapType type;
  iterator __end2;
  iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  IndexMap *typeIndices_local;
  unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
  *implicitTypes_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types_local;
  Lexer *in_local;
  ParseImplicitTypeDefsCtx *this_local;
  
  TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::TypeParserCtx
            (&this->super_TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>,typeIndices);
  Lexer::Lexer(&this->in,in);
  this->types = types;
  this->implicitTypes = implicitTypes;
  std::
  unordered_map<wasm::Signature,_wasm::HeapType,_std::hash<wasm::Signature>,_std::equal_to<wasm::Signature>,_std::allocator<std::pair<const_wasm::Signature,_wasm::HeapType>_>_>
  ::unordered_map(&this->sigTypes);
  __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(types);
  type.id = (uintptr_t)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(types);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                *)&type);
    if (!bVar1) break;
    pHVar2 = __gnu_cxx::
             __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2);
    local_50.id = pHVar2->id;
    bVar1 = HeapType::isSignature(&local_50);
    local_ca = 0;
    if (bVar1) {
      local_68[0] = HeapType::getRecGroup(&local_50);
      sVar3 = RecGroup::size(local_68);
      local_ca = 0;
      if (sVar3 == 1) {
        oVar4 = HeapType::getDeclaredSuperType(&local_50);
        local_78 = oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_payload;
        local_70 = oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_engaged;
        bVar1 = std::optional::operator_cast_to_bool((optional *)&local_78._M_value);
        local_ca = 0;
        if (!bVar1) {
          bVar1 = HeapType::isOpen(&local_50);
          local_ca = 0;
          if (!bVar1) {
            bVar1 = HeapType::isShared(&local_50);
            local_ca = bVar1 ^ 0xff;
          }
        }
      }
    }
    if ((local_ca & 1) != 0) {
      SVar5 = HeapType::getSignature(&local_50);
      local_a0 = SVar5;
      std::pair<const_wasm::Signature,_wasm::HeapType>::
      pair<wasm::Signature,_wasm::HeapType_&,_true>(&local_90,&local_a0,&local_50);
      std::
      unordered_map<wasm::Signature,_wasm::HeapType,_std::hash<wasm::Signature>,_std::equal_to<wasm::Signature>,_std::allocator<std::pair<const_wasm::Signature,_wasm::HeapType>_>_>
      ::insert(&this->sigTypes,&local_90);
    }
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

ParseImplicitTypeDefsCtx(Lexer& in,
                           std::vector<HeapType>& types,
                           std::unordered_map<Index, HeapType>& implicitTypes,
                           const IndexMap& typeIndices)
    : TypeParserCtx<ParseImplicitTypeDefsCtx>(typeIndices), in(in),
      types(types), implicitTypes(implicitTypes) {
    for (auto type : types) {
      if (type.isSignature() && type.getRecGroup().size() == 1 &&
          !type.getDeclaredSuperType() && !type.isOpen() && !type.isShared()) {
        sigTypes.insert({type.getSignature(), type});
      }
    }
  }